

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void dumpBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *value,bool inArray)

{
  byte bVar1;
  pointer puVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  pointer puVar9;
  size_t j;
  long lVar10;
  ulong uVar11;
  pointer puVar12;
  
  puVar2 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)puVar9 - (long)puVar2;
  if (uVar4 < 8) {
    uVar6 = 0;
  }
  else {
    lVar8 = 0;
    uVar7 = 8;
    do {
      uVar6 = uVar7;
      lVar10 = 0;
      do {
        printf("%02hhx ",
               (ulong)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar10 + lVar8]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      if (inArray) {
        putchar(0x20);
      }
      putchar(0x3c);
      lVar10 = 0;
      do {
        bVar1 = (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar10 + lVar8];
        uVar5 = (uint)bVar1;
        iVar3 = isgraph((uint)bVar1);
        if (iVar3 == 0) {
          uVar5 = 0x2e;
        }
        putchar(uVar5);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      puts(">");
      lVar8 = lVar8 + 8;
      uVar7 = uVar6 + 8;
    } while (uVar6 + 8 <= uVar4);
  }
  uVar7 = uVar4 - uVar6;
  if (uVar4 != uVar6) {
    uVar11 = 0;
    do {
      printf("%02hhx ",
             (ulong)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar11 + uVar6]);
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar7);
    uVar11 = ~uVar6;
    if (uVar7 < 8) {
      puVar12 = puVar9 + (uVar11 - (long)puVar2);
      do {
        printf("   ");
        puVar12 = puVar12 + 1;
      } while (puVar12 < (pointer)0x7);
    }
    if (inArray) {
      putchar(0x20);
    }
    putchar(0x3c);
    do {
      uVar5 = (uint)(value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar6];
      iVar3 = isgraph(uVar5);
      if (iVar3 == 0) {
        uVar5 = 0x2e;
      }
      putchar(uVar5);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    if (uVar7 < 8) {
      puVar9 = puVar9 + (uVar11 - (long)puVar2);
      do {
        putchar(0x20);
        puVar9 = puVar9 + 1;
      } while (puVar9 < (pointer)0x7);
    }
    puts(">");
    return;
  }
  return;
}

Assistant:

void dumpBytes(const std::vector<uint8_t>& value, bool inArray = false)
{
	size_t len = value.size();
	size_t i = 0;
	while (i + 8 <= len)
	{
		for (size_t j = 0; j < 8; j++)
		{
			printf("%02hhx ", value[i + j]);
		}
		if (inArray)
		{
			printf(" ");
		}
		printf("<");
		for (size_t j = 0; j < 8; j++)
		{
			uint8_t c = value[i + j];
			if (isgraph((int) c) == 0)
			{
				printf(".");
			}
			else
			{
				printf("%c", (int) c);
			}
		}
		printf(">\n");
		i += 8;
	}
	len -= i;
	if (len == 0)
	{
		return;
	}

	for (size_t j = 0; j < len; j++)
	{
		printf("%02hhx ", value[i + j]);
	}
	for (size_t j = len; j < 8; j++)
	{
		printf("   ");
	}
	if (inArray)
	{
		printf(" ");
	}
	printf("<");
	for (size_t j = 0; j < len; j++)
	{
		uint8_t c = value[i + j];
		if (isgraph((int) c) == 0)
		{
			printf(".");
		}
		else
		{
			printf("%c", (int) c);
		}
	}
	for (size_t j =len; j < 8; j++)
	{
		printf(" ");
	}
	printf(">\n");
}